

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<int,phmap::test_internal::MovableOnlyInstance>::
     move<std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>>
               (allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_> *alloc,
               slot_type *src,slot_type *dest)

{
  slot_type *dest_local;
  slot_type *src_local;
  allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_> *alloc_local;
  
  std::pair<int,_phmap::test_internal::MovableOnlyInstance>::operator=
            ((pair<int,_phmap::test_internal::MovableOnlyInstance> *)&dest->value,(type)&src->value)
  ;
  return;
}

Assistant:

static void move(Allocator* alloc, slot_type* src, slot_type* dest) {
        if (kMutableKeys::value) {
            dest->mutable_value = std::move(src->mutable_value);
        } else {
            phmap::allocator_traits<Allocator>::destroy(*alloc, &dest->value);
            phmap::allocator_traits<Allocator>::construct(*alloc, &dest->value,
                                                          std::move(src->value));
        }
    }